

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

uint32 er_hint_hash_fn(State *a,hash_fns_t *fns)

{
  uint uVar1;
  Term *pTVar2;
  uint uVar3;
  Term *ta;
  uint32 i;
  uint32 hash;
  VecHint *sa;
  hash_fns_t *fns_local;
  State *a_local;
  
  ta._4_4_ = 0;
  for (ta._0_4_ = 0; (uint)ta < (a->error_recovery_hints).n; ta._0_4_ = (uint)ta + 1) {
    pTVar2 = (((a->error_recovery_hints).v[(uint)ta]->rule->elems).v
              [((a->error_recovery_hints).v[(uint)ta]->rule->elems).n - 1]->e).term;
    uVar1 = (a->error_recovery_hints).v[(uint)ta]->depth;
    uVar3 = strhashl(pTVar2->string,pTVar2->string_len);
    ta._4_4_ = uVar3 + (uVar1 + 1) * 0xd + ta._4_4_;
    if ((a->error_recovery_hints).v[(uint)ta]->rule != (Rule *)0x0) {
      ta._4_4_ = (a->error_recovery_hints).v[(uint)ta]->rule->prod->index * 0x2717 + ta._4_4_;
    }
  }
  return ta._4_4_;
}

Assistant:

static uint32 er_hint_hash_fn(State *a, hash_fns_t *fns) {
  VecHint *sa = &a->error_recovery_hints;
  uint32 hash = 0, i;
  Term *ta;
  (void)fns;

  for (i = 0; i < sa->n; i++) {
    ta = sa->v[i]->rule->elems.v[sa->v[i]->rule->elems.n - 1]->e.term;
    hash += (sa->v[i]->depth + 1) * 13;
    hash += strhashl(ta->string, ta->string_len);
    if (sa->v[i]->rule) hash += sa->v[i]->rule->prod->index * 10007;
  }
  return hash;
}